

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterList.h
# Opt level: O0

Commandline * __thiscall
bhf::Commandline::Pop<std::__cxx11::string>(Commandline *this,string *errorMessage)

{
  undefined8 *puVar1;
  char *pcVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *errorMessage_local;
  Commandline *this_local;
  
  errorMessage_local = errorMessage;
  this_local = this;
  if (*(int *)(errorMessage + 0x20) == 0) {
    local_20 = in_RDX;
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)errorMessage,local_20);
    }
    std::__cxx11::string::string((string *)this);
  }
  else {
    *(int *)(errorMessage + 0x20) = *(int *)(errorMessage + 0x20) + -1;
    puVar1 = *(undefined8 **)(errorMessage + 0x28);
    *(undefined8 **)(errorMessage + 0x28) = puVar1 + 1;
    pcVar2 = (char *)*puVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,pcVar2,&local_41);
    std::__cxx11::string::string(local_78);
    bhf::StringTo<std::__cxx11::string>(this,local_40,local_78);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
  }
  return this;
}

Assistant:

T Pop(const std::string& errorMessage = {})
    {
        if (argc) {
            --argc;
            return StringTo<T>(*(argv++));
        }
        if (!errorMessage.empty()) {
            usage(errorMessage);
        }
        return T {};
    }